

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaeValidator.cpp
# Opt level: O2

int __thiscall opencollada::DaeValidator::checkUniqueSids(DaeValidator *this,Dae *dae)

{
  bool bVar1;
  ostream *poVar2;
  XmlNodeSet *pXVar3;
  size_t sVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  int iVar7;
  iterator iVar8;
  allocator local_101;
  Dae *local_100;
  XmlNode child;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  sids;
  XmlAttribute local_c0;
  XmlNode parent;
  iterator local_b0;
  iterator local_a0;
  string sid;
  iterator local_70;
  iterator local_60;
  string local_50;
  
  poVar2 = ::std::operator<<((ostream *)&::std::cout,"Checking unique sids...");
  ::std::endl<char,std::char_traits<char>>(poVar2);
  local_100 = dae;
  sid._M_dataplus._M_p = (pointer)XmlDoc::root(&dae->super_XmlDoc);
  ::std::__cxx11::string::string((string *)&sids,"//*[@sid]/..",(allocator *)&local_50);
  pXVar3 = XmlNode::selectNodes((XmlNode *)&sid,(string *)&sids);
  ::std::__cxx11::string::~string((string *)&sids);
  iVar8 = XmlNodeSet::begin(pXVar3);
  local_60.mNodeSet = iVar8.mNodeSet;
  local_60.mIndex = iVar8.mIndex;
  iVar8 = XmlNodeSet::end(pXVar3);
  local_70.mNodeSet = iVar8.mNodeSet;
  local_70.mIndex = iVar8.mIndex;
  local_100 = (Dae *)&local_100->mUri;
  iVar7 = 0;
  while( true ) {
    bVar1 = XmlNodeSet::iterator::operator!=(&local_60,&local_70);
    if (!bVar1) break;
    parent = XmlNodeSet::iterator::operator*(&local_60);
    ::std::__cxx11::string::string((string *)&sids,"*[@sid]",(allocator *)&sid);
    pXVar3 = XmlNode::selectNodes(&parent,(string *)&sids);
    ::std::__cxx11::string::~string((string *)&sids);
    sids._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    sids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    sids._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &sids._M_t._M_impl.super__Rb_tree_header._M_header;
    sids._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    sids._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         sids._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    iVar8 = XmlNodeSet::begin(pXVar3);
    local_a0.mNodeSet = iVar8.mNodeSet;
    local_a0.mIndex = iVar8.mIndex;
    iVar8 = XmlNodeSet::end(pXVar3);
    local_b0.mNodeSet = iVar8.mNodeSet;
    local_b0.mIndex = iVar8.mIndex;
    while( true ) {
      bVar1 = XmlNodeSet::iterator::operator!=(&local_a0,&local_b0);
      if (!bVar1) break;
      child = XmlNodeSet::iterator::operator*(&local_a0);
      ::std::__cxx11::string::string((string *)&local_50,"sid",&local_101);
      local_c0 = XmlNode::attribute(&child,&local_50);
      XmlAttribute::value_abi_cxx11_(&sid,&local_c0);
      ::std::__cxx11::string::~string((string *)&local_50);
      sVar4 = XmlNode::line(&child);
      iVar5 = ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      *)&sids,&sid);
      if ((_Rb_tree_header *)iVar5._M_node == &sids._M_t._M_impl.super__Rb_tree_header) {
        pmVar6 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::operator[](&sids,&sid);
        *pmVar6 = sVar4;
      }
      else {
        poVar2 = operator<<((ostream *)&::std::cerr,(Uri *)local_100);
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        poVar2 = ::std::operator<<(poVar2,": Duplicated sid \"");
        poVar2 = ::std::operator<<(poVar2,(string *)&sid);
        poVar2 = ::std::operator<<(poVar2,"\". See first declaration at line ");
        poVar2 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        poVar2 = ::std::operator<<(poVar2,".");
        ::std::endl<char,std::char_traits<char>>(poVar2);
        iVar7 = 1;
      }
      ::std::__cxx11::string::~string((string *)&sid);
      XmlNodeSet::iterator::operator++(&local_a0);
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 *)&sids);
    XmlNodeSet::iterator::operator++(&local_60);
  }
  return iVar7;
}

Assistant:

int DaeValidator::checkUniqueSids(const Dae & dae) const
	{
		cout << "Checking unique sids..." << endl;

		int result = 0;
		const auto & parents = dae.root().selectNodes("//*[@sid]/..");
		for (auto parent : parents)
		{
			const auto & children = parent.selectNodes("*[@sid]");
			map<string, size_t> sids;
			for (auto child : children)
			{
				string sid = child.attribute("sid").value();
				size_t line = child.line();

				auto it = sids.find(sid);
				if (it != sids.end())
				{
					cerr << dae.getURI() << ":" << line << ": Duplicated sid \"" << sid << "\". See first declaration at line " << it->second << "." << endl;
					result |= 1;
				}
				else
				{
					sids[sid] = line;
				}
			}
		}
		return result;
	}